

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex_float.h
# Opt level: O0

void __thiscall
spvtools::utils::
HexFloat<spvtools::utils::FloatProxy<float>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<float>_>_>
::setFromSignUnbiasedExponentAndNormalizedSignificand
          (HexFloat<spvtools::utils::FloatProxy<float>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<float>_>_>
           *this,bool negative,int_type exponent,uint_type significand,bool round_denorm_up)

{
  bool bVar1;
  FloatProxy<float> local_28;
  uint local_24;
  bool local_1e;
  undefined1 local_1d;
  uint_type new_value;
  bool significand_is_zero;
  uint uStack_18;
  bool round_denorm_up_local;
  uint_type significand_local;
  int_type exponent_local;
  bool negative_local;
  HexFloat<spvtools::utils::FloatProxy<float>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<float>_>_>
  *this_local;
  
  new_value = significand;
  if (exponent < -0x7e) {
    new_value = (significand | 0x800000) >> 1;
  }
  bVar1 = exponent >= -0x7e;
  local_1e = bVar1 && significand == 0;
  for (uStack_18 = exponent; (int)uStack_18 < -0x7f; uStack_18 = uStack_18 + 1) {
    new_value = new_value >> 1;
  }
  if ((((uStack_18 == -0x7f) && (new_value == 0)) && (!bVar1 || significand != 0)) &&
     (round_denorm_up)) {
    new_value = 1;
  }
  local_24 = 0;
  if (negative) {
    local_24 = 0x80000000;
  }
  uStack_18 = uStack_18 + 0x7f;
  local_1d = round_denorm_up;
  significand_local._3_1_ = negative;
  _exponent_local = this;
  if ((int)uStack_18 < 0) {
    __assert_fail("exponent >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/util/hex_float.h"
                  ,0x1c9,
                  "void spvtools::utils::HexFloat<spvtools::utils::FloatProxy<float>>::setFromSignUnbiasedExponentAndNormalizedSignificand(bool, int_type, uint_type, bool) [T = spvtools::utils::FloatProxy<float>, Traits = spvtools::utils::HexFloatTraits<FloatProxy<float>>]"
                 );
  }
  uStack_18 = (uStack_18 & 0xff) << 0x17;
  new_value = new_value & 0x7fffff;
  local_24 = local_24 | uStack_18 | new_value;
  FloatProxy<float>::FloatProxy(&local_28,local_24);
  (this->value_).data_ = local_28.data_;
  return;
}

Assistant:

void setFromSignUnbiasedExponentAndNormalizedSignificand(
      bool negative, int_type exponent, uint_type significand,
      bool round_denorm_up) {
    bool significand_is_zero = significand == 0;

    if (exponent <= min_exponent) {
      // If this was denormalized, then we have to shift the bit on, meaning
      // the significand is not zero.
      significand_is_zero = false;
      significand |= first_exponent_bit;
      significand = static_cast<uint_type>(significand >> 1);
    }

    while (exponent < min_exponent) {
      significand = static_cast<uint_type>(significand >> 1);
      ++exponent;
    }

    if (exponent == min_exponent) {
      if (significand == 0 && !significand_is_zero && round_denorm_up) {
        significand = static_cast<uint_type>(0x1);
      }
    }

    uint_type new_value = 0;
    if (negative) {
      new_value = static_cast<uint_type>(new_value | sign_mask);
    }
    exponent = static_cast<int_type>(exponent + exponent_bias);
    assert(exponent >= 0);

    // put it all together
    exponent = static_cast<uint_type>((exponent << exponent_left_shift) &
                                      exponent_mask);
    significand = static_cast<uint_type>(significand & fraction_encode_mask);
    new_value = static_cast<uint_type>(new_value | (exponent | significand));
    value_ = T(new_value);
  }